

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::GetLanguageStandardRequired(cmGeneratorTarget *this,string *lang)

{
  bool bVar1;
  cmValue local_8;
  
  local_8 = GetPropertyWithPairedLanguageSupport(this,lang,"_STANDARD_REQUIRED");
  bVar1 = cmValue::IsOn(&local_8);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::GetLanguageStandardRequired(
  std::string const& lang) const
{
  return this->GetPropertyWithPairedLanguageSupport(lang, "_STANDARD_REQUIRED")
    .IsOn();
}